

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simultan.c
# Opt level: O3

int nonlin_common(Item *q4,int sensused)

{
  Symbol *s;
  bool bVar1;
  long lVar2;
  uint indx;
  uint uVar3;
  char *pcVar4;
  List *pLVar5;
  
  lVar2 = 0x41;
  indx = 0;
  bVar1 = false;
  do {
    pLVar5 = symlist[lVar2]->next;
    if (pLVar5 != symlist[lVar2]) {
      do {
        s = (pLVar5->element).sym;
        if (((s->subtype & 0x10) != 0) && (s->used != 0)) {
          s->varnum = indx;
          slist_data(s,indx,numlist);
          if ((s->subtype & 0x20) == 0) {
            sprintf(buf,"_slist%d[%d] = &(%s) - _p;\n",(ulong)(uint)numlist,(ulong)indx,s->name);
            uVar3 = 1;
          }
          else {
            uVar3 = s->araydim;
            sprintf(buf,"for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n",(ulong)uVar3,
                    (ulong)(uint)numlist,(ulong)indx,s->name);
            bVar1 = true;
          }
          indx = uVar3 + indx;
          lappendstr(initlist,buf);
          s->used = 0;
          if (sensused != 0) {
            add_sens_statelist(s);
          }
        }
        pLVar5 = pLVar5->next;
      } while (pLVar5 != symlist[lVar2]);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x7b);
  pLVar5 = eqnq->next;
  if (pLVar5 == eqnq) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      lVar2 = ((pLVar5->element).sym)->subtype;
      pcVar4 = *(char **)(lVar2 + 0x48);
      if (*pcVar4 == 'D') {
        uVar3 = uVar3 + *(int *)(lVar2 + 0x38);
        pcVar4 = "_dlist%d[(++_counte)*_STRIDE] =";
LAB_00117cc4:
        sprintf(buf,pcVar4,(ulong)(uint)numlist);
      }
      else {
        if (((*pcVar4 == '~') && (pcVar4[1] == '+')) && (pcVar4[2] == '\0')) {
          pcVar4 = "_dlist%d[_counte] +=";
          if (uVar3 == 0xffffffff) {
            diag("no previous equation for adding terms",(char *)0x0);
          }
          goto LAB_00117cc4;
        }
        sprintf(buf,"_dlist%d[(++_counte)*_STRIDE] =",(ulong)(uint)numlist);
        uVar3 = uVar3 + 1;
      }
      replacstr((pLVar5->element).itm,buf);
      pLVar5 = pLVar5->next;
    } while (pLVar5 != eqnq);
  }
  if (bVar1) {
    sprintf(buf,
            "if(_counte != %d) printf( \"Number of equations, %%d, does not equal number of states, %d\", _counte + 1);\n"
            ,(ulong)(indx - 1),(ulong)indx);
    insertstr(q4,buf);
  }
  else if (uVar3 != indx) {
    sprintf(buf,"Number of equations, %d, does not equal number, %d",(ulong)uVar3,(ulong)indx);
    diag(buf," of states used");
  }
  if (uVar3 != 0) {
    freelist(&eqnq);
    sprintf(buf,"_slist%d",(ulong)(uint)numlist);
    add_global_var("int",buf,0,1,(sens_parm + 1) * indx,1);
    return indx;
  }
  diag("NONLINEAR contains no equations",(char *)0x0);
}

Assistant:

static int nonlin_common(q4, sensused)	/* used by massagenonlin() and mixed_eqns() */
	Item *q4;
	int sensused;
{
	Item *lq, *qs, *q;
	int i, counts = 0, counte = 0, using_array;
	Symbol *s;

	using_array=0;

	counts =0;
	SYMITER_STAT {
		if (s->used) {
			if (s->subtype & ARRAY) {int dim = s->araydim;
				counts += dim;
			}else{
				counts++;
			}
		}
	}

	counts = 0;
	SYMITER_STAT {
		if (s->used) {
			s->varnum = counts;
#if CVODE
			slist_data(s, counts, numlist);
#endif
			if (s->subtype & ARRAY) {int dim = s->araydim;
				using_array=1;
		        	Sprintf(buf, "for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n"
			                ,dim, numlist , counts, s->name);
				counts += dim;
			}else{
				Sprintf(buf, "_slist%d[%d] = &(%s) - _p;\n",
					numlist, counts, s->name);
				counts++;
			}
		        Lappendstr(initlist, buf);
			s->used = 0;
			if (sensused) {
				add_sens_statelist(s);
			}
		}
	}

	ITERATE(lq, eqnq) {
		char *eqtype = SYM(ITM(lq))->name;
		if (strcmp(eqtype, "~+") == 0) { /* add equation to previous */
			if (counte == -1) {
				diag("no previous equation for adding terms", (char *)0);
			}
			Sprintf(buf, "_dlist%d[_counte] +=", numlist);
		} else if (eqtype[0] == 'D') {
			/* derivative equations using implicit method */
			int count_deriv = SYM(ITM(lq))->araydim;
			Sprintf(buf, "_dlist%d[(++_counte)*_STRIDE] =", numlist);
			counte += count_deriv;
		}else{
			Sprintf(buf, "_dlist%d[(++_counte)*_STRIDE] =", numlist);
			counte++;
		}
		replacstr(ITM(lq), buf);
	}
	if (!using_array) {
		if(counte != counts) {
Sprintf(buf ,"Number of equations, %d, does not equal number, %d", counte, counts);
			diag(buf, " of states used");
		}
	} else {
#if 1	/* can give message when running */
Sprintf(buf, "if(_counte != %d) printf( \"Number of equations, %%d,\
 does not equal number of states, %d\", _counte + 1);\n",
			counts-1, counts);
		Insertstr(q4, buf);
#endif
	}
	if (counte == 0) {
		diag("NONLINEAR contains no equations", (char *)0);
	}
	freeqnqueue();
	Sprintf(buf, "_slist%d", numlist);
	add_global_var("int", buf, 0, 1, counts*(1 + sens_parm), 1);
	return counts;
}